

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_diag_sse41_128_64.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_stats_diag_sse41_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  int64_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  undefined8 uVar10;
  uint uVar11;
  parasail_result_t *ppVar12;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t *ptr_02;
  int64_t *ptr_03;
  int64_t *ptr_04;
  int64_t *ptr_05;
  int64_t *ptr_06;
  int64_t *ptr_07;
  int64_t *ptr_08;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  int iVar23;
  int iVar24;
  bool bVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  undefined1 auVar30 [16];
  long lVar39;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  __m128i_64_t A;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  long lVar53;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined4 uVar61;
  __m128i_64_t B_1;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  long lVar65;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  __m128i_64_t B;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  long lVar72;
  long lVar75;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  __m128i_64_t B_3;
  int64_t iVar77;
  undefined1 auVar76 [16];
  __m128i_64_t B_8;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  __m128i_64_t B_7;
  __m128i_64_t B_4;
  undefined1 auVar82 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar83 [16];
  __m128i_64_t B_6;
  __m128i_64_t B_5;
  __m128i vMaxHCol;
  __m128i vMaxHRow;
  undefined1 local_4b8 [16];
  undefined1 local_498 [16];
  undefined1 local_478 [16];
  long local_468;
  long local_458;
  undefined1 local_448 [16];
  long local_428;
  undefined1 local_418 [16];
  long local_408;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  ulong local_2b8;
  long local_2b0;
  int *local_2a8;
  long local_2a0;
  ulong local_298;
  ulong local_290;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  long local_198;
  undefined8 uStack_190;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  long local_168;
  long lStack_160;
  undefined1 local_158 [16];
  long local_148;
  long lStack_140;
  undefined1 local_138 [16];
  int local_128;
  undefined4 uStack_124;
  int iStack_120;
  undefined4 uStack_11c;
  long local_118;
  long lStack_110;
  long local_108;
  long lStack_100;
  long local_f8;
  ulong uStack_f0;
  undefined1 local_e8 [16];
  long local_d8;
  long lStack_d0;
  long local_c8;
  long lStack_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  long local_88;
  long lStack_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long lVar22;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_stats_diag_sse41_128_64_cold_8();
    return (parasail_result_t *)0x0;
  }
  uVar28 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    parasail_sg_flags_stats_diag_sse41_128_64_cold_7();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sg_flags_stats_diag_sse41_128_64_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sg_flags_stats_diag_sse41_128_64_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_stats_diag_sse41_128_64_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_stats_diag_sse41_128_64_cold_3();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_stats_diag_sse41_128_64_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_sg_flags_stats_diag_sse41_128_64_cold_1();
      return (parasail_result_t *)0x0;
    }
    if (matrix->type == 0) goto LAB_00698232;
  }
  _s1Len = matrix->length;
LAB_00698232:
  uVar11 = _s1Len - 1;
  iVar23 = matrix->min;
  iVar24 = -open;
  uVar18 = 0x8000000000000000 - (long)iVar23;
  if (iVar23 != iVar24 && SBORROW4(iVar23,iVar24) == iVar23 + open < 0) {
    uVar18 = (ulong)(uint)open | 0x8000000000000000;
  }
  uVar16 = s2Len - 1;
  lVar22 = uVar18 + 1;
  lVar20 = 0x7ffffffffffffffe - (long)matrix->max;
  auVar40._8_4_ = (int)lVar22;
  auVar40._0_8_ = lVar22;
  auVar40._12_4_ = (int)((ulong)lVar22 >> 0x20);
  lVar27 = (long)_s1Len;
  lVar1 = lVar27 + -1;
  lVar2 = uVar28 - 1;
  local_288 = (undefined1  [16])0x0;
  local_3a8 = (undefined1  [16])0x0;
  if (s1_beg == 0) {
    local_288._4_4_ = 0;
    local_288._0_4_ = gap * 2;
    local_288._8_4_ = gap * 2;
    local_288._12_4_ = 0;
    auVar30._4_4_ = iVar24;
    auVar30._0_4_ = iVar24 - gap;
    auVar30._8_8_ = 0;
    local_3a8 = pmovsxdq(auVar30,auVar30);
  }
  local_2e8 = auVar40;
  local_2d8 = auVar40;
  local_2c8 = auVar40;
  local_248 = auVar40;
  local_238 = auVar40;
  local_228 = auVar40;
  local_218 = auVar40;
  local_208 = auVar40;
  local_1f8 = auVar40;
  local_1e8 = auVar40;
  local_1d8 = auVar40;
  local_1c8 = auVar40;
  local_1b8 = auVar40;
  local_1a8 = auVar40;
  ppVar12 = parasail_result_new_stats();
  if (ppVar12 != (parasail_result_t *)0x0) {
    ppVar12->flag =
         (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
         (uint)(s2_end != 0) << 0xf | ppVar12->flag | 0x2811002;
    local_2b8 = uVar18;
    ptr = parasail_memalign_int64_t(0x10,(long)(_s1Len + 1));
    uVar18 = (ulong)(s2Len + 2);
    ptr_00 = parasail_memalign_int64_t(0x10,uVar18);
    ptr_01 = parasail_memalign_int64_t(0x10,uVar18);
    ptr_02 = parasail_memalign_int64_t(0x10,uVar18);
    ptr_03 = parasail_memalign_int64_t(0x10,uVar18);
    ptr_04 = parasail_memalign_int64_t(0x10,uVar18);
    ptr_05 = parasail_memalign_int64_t(0x10,uVar18);
    ptr_06 = parasail_memalign_int64_t(0x10,uVar18);
    ptr_07 = parasail_memalign_int64_t(0x10,uVar18);
    ptr_08 = parasail_memalign_int64_t(0x10,uVar18);
    auVar46._0_8_ = -(ulong)(ptr == (int64_t *)0x0);
    auVar46._8_8_ = -(ulong)(ptr_00 == (int64_t *)0x0);
    auVar41._0_8_ = -(ulong)(ptr_01 == (int64_t *)0x0);
    auVar41._8_8_ = -(ulong)(ptr_02 == (int64_t *)0x0);
    auVar30 = packssdw(auVar46,auVar41);
    auVar45._0_8_ = -(ulong)(ptr_03 == (int64_t *)0x0);
    auVar45._8_8_ = -(ulong)(ptr_04 == (int64_t *)0x0);
    auVar58._0_8_ = -(ulong)(ptr_05 == (int64_t *)0x0);
    auVar58._8_8_ = -(ulong)(ptr_06 == (int64_t *)0x0);
    auVar46 = packssdw(auVar45,auVar58);
    auVar30 = packssdw(auVar30,auVar46);
    if ((ptr_08 != (int64_t *)0x0 && ptr_07 != (int64_t *)0x0) &&
        ((((((((((((((((auVar30 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar30 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar30 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar30 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar30 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar30 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar30 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar30 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar30 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar30 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar30 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar30 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar30 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar30 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar30 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar30[0xf]))
    {
      if (0 < _s1Len) {
        piVar3 = matrix->mapper;
        lVar17 = 0;
        do {
          ptr[lVar17] = (long)piVar3[(byte)_s1[lVar17]];
          lVar17 = lVar17 + 1;
        } while (lVar27 != lVar17);
      }
      uVar61 = (undefined4)((ulong)lVar20 >> 0x20);
      local_378._8_4_ = (int)lVar20;
      local_378._0_8_ = lVar20;
      local_378._12_4_ = uVar61;
      local_128 = open;
      uStack_124 = 0;
      iStack_120 = open;
      uStack_11c = 0;
      local_138._0_8_ = CONCAT44(0,gap);
      local_138._8_4_ = gap;
      local_138._12_4_ = 0;
      auVar30 = local_138;
      local_168 = lVar1;
      lStack_160 = lVar1;
      local_148 = lVar2;
      lStack_140 = lVar2;
      ptr[lVar27] = 0;
      piVar3 = matrix->mapper;
      uVar18 = 0;
      do {
        ptr_00[uVar18 + 1] = (long)piVar3[(byte)_s2[uVar18]];
        uVar18 = uVar18 + 1;
      } while (uVar28 != uVar18);
      *ptr_00 = 0;
      ptr_00[uVar28 + 1] = 0;
      local_2a0 = (long)iVar24;
      if (s2_beg == 0) {
        uVar18 = 0;
        lVar17 = local_2a0;
        do {
          ptr_01[uVar18 + 1] = lVar17;
          ptr_02[uVar18 + 1] = 0;
          ptr_03[uVar18 + 1] = 0;
          ptr_04[uVar18 + 1] = 0;
          ptr_05[uVar18 + 1] = lVar22;
          ptr_06[uVar18 + 1] = 0;
          ptr_07[uVar18 + 1] = 0;
          ptr_08[uVar18 + 1] = 0;
          uVar18 = uVar18 + 1;
          lVar17 = lVar17 - (ulong)(uint)gap;
        } while (uVar28 != uVar18);
      }
      else {
        uVar18 = 0;
        do {
          ptr_01[uVar18 + 1] = 0;
          ptr_02[uVar18 + 1] = 0;
          ptr_03[uVar18 + 1] = 0;
          ptr_04[uVar18 + 1] = 0;
          ptr_05[uVar18 + 1] = lVar22;
          ptr_06[uVar18 + 1] = 0;
          ptr_07[uVar18 + 1] = 0;
          ptr_08[uVar18 + 1] = 0;
          uVar18 = uVar18 + 1;
        } while (uVar28 != uVar18);
      }
      *ptr_02 = 0;
      *ptr_03 = 0;
      *ptr_04 = 0;
      *ptr_05 = 0;
      *ptr_06 = 0;
      *ptr_07 = 0;
      *ptr_08 = 0;
      ptr_01[uVar28 + 1] = 0;
      ptr_02[uVar28 + 1] = 0;
      ptr_03[uVar28 + 1] = 0;
      ptr_04[uVar28 + 1] = 0;
      ptr_05[uVar28 + 1] = 0;
      ptr_06[uVar28 + 1] = 0;
      ptr_07[uVar28 + 1] = 0;
      ptr_08[uVar28 + 1] = 0;
      *ptr_01 = 0;
      local_308 = auVar40;
      local_318 = auVar40;
      local_388 = auVar40;
      local_2e8 = auVar40;
      local_228 = auVar40;
      local_338 = auVar40;
      local_398 = auVar40;
      local_348 = auVar40;
      local_358 = auVar40;
      local_238 = auVar40;
      local_368 = auVar40;
      local_328 = auVar40;
      local_248 = auVar40;
      if (0 < _s1Len) {
        local_198 = lVar20;
        uStack_190 = 0;
        local_2a8 = matrix->matrix;
        local_2b0 = (long)matrix->size;
        iVar23 = matrix->type;
        local_178 = auVar40 >> 0x40;
        auVar41 = local_178;
        local_290 = (ulong)(s2Len + 1);
        auVar82._4_4_ = _s1Len;
        auVar82._0_4_ = _s1Len;
        auVar82._8_8_ = 0;
        local_188 = pmovzxdq(auVar82,auVar82);
        auVar46 = local_188;
        auVar42._4_4_ = s2Len;
        auVar42._0_4_ = s2Len;
        auVar42._8_8_ = 0;
        local_158 = pmovzxdq(auVar42,auVar42);
        auVar45 = local_158;
        auVar66 = pmovsxbq(in_XMM7,1);
        local_298 = 0;
        do {
          uVar14 = (uint)local_298;
          uVar13 = uVar14 | 1;
          if (lVar27 <= (long)(local_298 | 1)) {
            uVar13 = uVar11;
          }
          uStack_f0 = ptr[local_298];
          local_f8 = ptr[local_298 + 1];
          lVar17 = (long)(int)uVar13;
          uVar28 = local_298;
          if (iVar23 == 0) {
            lVar17 = local_f8;
            uVar28 = uStack_f0;
          }
          local_298 = local_298 + 2;
          iVar26 = iVar24 - uVar14 * gap;
          local_178._0_8_ = auVar40._8_8_;
          iVar77 = *ptr_01;
          *ptr_01 = local_2a0 - local_298 * (uint)gap;
          if (s1_beg != 0) {
            iVar26 = 0;
          }
          local_278._8_8_ = (long)iVar26;
          local_278._0_8_ = local_178._0_8_;
          lVar29 = auVar66._0_8_;
          lVar39 = auVar66._8_8_;
          local_108 = -(ulong)(lVar29 == lVar1);
          lStack_100 = -(ulong)(lVar39 == lVar1);
          local_118 = -(ulong)(lVar29 < (long)local_188._0_8_);
          lStack_110 = -(ulong)(lVar39 < (long)local_188._8_8_);
          uVar18 = 0;
          local_498 = pmovsxbq(in_XMM15,0xff);
          local_478 = (undefined1  [16])0x0;
          local_268 = (undefined1  [16])0x0;
          local_258 = (undefined1  [16])0x0;
          local_4b8 = ZEXT816(0);
          local_448 = (undefined1  [16])0x0;
          local_418 = (undefined1  [16])0x0;
          auVar82 = (undefined1  [16])0x0;
          auVar42 = (undefined1  [16])0x0;
          in_XMM15 = (undefined1  [16])0x0;
          local_e8 = auVar66;
          auVar58 = auVar40;
          lVar19 = 0;
          lVar53 = 0;
          lVar15 = 0;
          lVar65 = 0;
          lVar72 = 0;
          lVar75 = 0;
          local_3e8 = auVar40;
          local_3d8 = auVar40;
          do {
            local_78 = local_248;
            local_68 = local_228;
            local_58 = local_238;
            local_48 = local_2e8;
            uVar10 = local_278._8_8_;
            local_c8 = lVar72;
            lStack_c0 = lVar75;
            local_b8._0_8_ = in_XMM15._8_8_;
            iVar4 = ptr_02[uVar18 + 1];
            local_b8._8_8_ = iVar4;
            local_d8 = lVar15;
            lStack_d0 = lVar65;
            local_a8._0_8_ = auVar42._8_8_;
            iVar5 = ptr_03[uVar18 + 1];
            local_a8._8_8_ = iVar5;
            local_98._0_8_ = auVar82._8_8_;
            iVar6 = ptr_04[uVar18 + 1];
            local_98._8_8_ = iVar6;
            auVar83._8_8_ = ptr_06[uVar18 + 1];
            auVar83._0_8_ = local_258._8_8_;
            auVar76._8_8_ = ptr_07[uVar18 + 1];
            auVar76._0_8_ = local_268._8_8_;
            auVar54._8_8_ = ptr_08[uVar18 + 1];
            auVar54._0_8_ = local_478._8_8_;
            local_88 = local_278._8_8_;
            lStack_80 = ptr_01[uVar18 + 1];
            auVar78._0_8_ = local_278._8_8_ - (ulong)(uint)open;
            auVar78._8_8_ = ptr_01[uVar18 + 1] - (ulong)(uint)open;
            local_138._12_4_ = 0;
            auVar59._0_8_ = auVar58._8_8_ - local_138._0_8_;
            auVar59._8_8_ = ptr_05[uVar18 + 1] - local_138._8_8_;
            auVar70._0_8_ = -(ulong)(auVar59._0_8_ < auVar78._0_8_);
            auVar70._8_8_ = -(ulong)(auVar59._8_8_ < auVar78._8_8_);
            local_258 = blendvpd(auVar83,local_b8,auVar70);
            local_268 = blendvpd(auVar76,local_a8,auVar70);
            auVar55 = blendvpd(auVar54,local_98,auVar70);
            auVar80._0_8_ = local_278._0_8_ - (ulong)(uint)open;
            auVar80._8_8_ = local_278._8_8_ - (ulong)(uint)open;
            auVar69._0_8_ = local_3e8._0_8_ - local_138._0_8_;
            auVar69._8_8_ = local_3e8._8_8_ - local_138._8_8_;
            auVar47._0_8_ = -(ulong)(auVar69._0_8_ < auVar80._0_8_);
            auVar47._8_8_ = -(ulong)(auVar69._8_8_ < auVar80._8_8_);
            local_418 = blendvpd(local_418,in_XMM15,auVar47);
            local_448 = blendvpd(local_448,auVar42,auVar47);
            auVar82 = blendvpd(local_4b8,auVar82,auVar47);
            local_3d8._0_8_ = local_3d8._8_8_;
            local_3d8._8_8_ = ptr_00[uVar18 + 1];
            iVar26 = local_2a8[uVar28 * local_2b0 + local_3d8._8_8_];
            auVar67._8_8_ = 0;
            auVar67._0_8_ = (long)iVar26;
            auVar58 = blendvpd(auVar59,auVar78,auVar70);
            auVar79._0_8_ = (long)local_2a8[lVar17 * local_2b0 + ptr_00[uVar18]] + local_178._0_8_;
            auVar79._8_8_ = iVar26 + iVar77;
            auVar63._0_4_ = -(uint)(0 < local_2a8[lVar17 * local_2b0 + ptr_00[uVar18]]);
            auVar63._4_4_ = -(uint)(0 < iVar26);
            auVar63._8_8_ = 0;
            auVar42 = pmovzxdq(auVar67,auVar63);
            auVar68._0_8_ = SUB168(auVar42 & _DAT_009050f0,0) + lVar15;
            auVar68._8_8_ = SUB168(auVar42 & _DAT_009050f0,8) + lVar65;
            auVar70 = blendvpd(auVar69,auVar80,auVar47);
            auVar74._0_8_ = -(ulong)(auVar70._0_8_ < auVar79._0_8_);
            auVar74._8_8_ = -(ulong)(auVar70._8_8_ < auVar79._8_8_);
            auVar42 = blendvpd(auVar70,auVar79,auVar74);
            auVar48._0_8_ = -(ulong)(auVar58._0_8_ < auVar42._0_8_);
            auVar48._8_8_ = -(ulong)(auVar58._8_8_ < auVar42._8_8_);
            auVar59 = blendvpd(auVar58,auVar42,auVar48);
            auVar62._8_4_ = 0xffffffff;
            auVar62._0_8_ = 0xffffffffffffffff;
            auVar62._12_4_ = 0xffffffff;
            local_478._0_8_ = auVar55._0_8_ + 1;
            local_478._8_8_ = auVar55._8_8_ - auVar62._8_8_;
            auVar55._0_8_ = -(ulong)(auVar79._0_8_ == auVar59._0_8_);
            auVar55._8_8_ = -(ulong)(auVar79._8_8_ == auVar59._8_8_);
            auVar42 = blendvpd(local_258,local_418,auVar48);
            auVar73._0_8_ = lVar72 + (ulong)(local_f8 == local_3d8._0_8_);
            auVar73._8_8_ = lVar75 + (ulong)(uStack_f0 == local_3d8._8_8_);
            auVar79 = blendvpd(auVar42,auVar73,auVar55);
            auVar42 = blendvpd(local_268,local_448,auVar48);
            local_4b8._0_8_ = auVar82._0_8_;
            local_4b8._8_8_ = auVar82._8_8_;
            auVar81._8_4_ = 0xffffffff;
            auVar81._0_8_ = 0xffffffffffffffff;
            auVar81._12_4_ = 0xffffffff;
            local_4b8._8_8_ = local_4b8._8_8_ - auVar62._8_8_;
            local_4b8._0_8_ = local_4b8._0_8_ + 1;
            auVar74 = blendvpd(auVar42,auVar68,auVar55);
            auVar82 = blendvpd(local_478,local_4b8,auVar48);
            auVar49._0_8_ = lVar19 + 1;
            auVar49._8_8_ = lVar53 - auVar81._8_8_;
            auVar63 = blendvpd(auVar82,auVar49,auVar55);
            auVar43._0_8_ = -(ulong)(local_498._0_8_ == -1);
            auVar43._8_8_ = -(ulong)(local_498._8_8_ == auVar81._8_8_);
            local_278 = blendvpd(auVar59,local_3a8,auVar43);
            in_XMM15 = ~auVar43 & auVar79;
            auVar42 = ~auVar43 & auVar74;
            local_3e8 = blendvpd(auVar70,auVar40,auVar43);
            auVar82 = ~auVar43 & auVar63;
            lVar19 = local_278._0_8_;
            lVar53 = local_278._8_8_;
            if (1 < uVar18) {
              auVar31._0_8_ = -(ulong)(local_378._0_8_ < lVar19);
              auVar31._8_8_ = -(ulong)(local_378._8_8_ < lVar53);
              local_378 = blendvpd(local_278,local_378,auVar31);
              auVar32._0_8_ = -(ulong)(lVar19 < local_388._0_8_);
              auVar32._8_8_ = -(ulong)(lVar53 < local_388._8_8_);
              auVar70 = blendvpd(local_278,local_388,auVar32);
              auVar33._0_8_ = -(ulong)(in_XMM15._0_8_ < auVar70._0_8_);
              auVar33._8_8_ = -(ulong)(in_XMM15._8_8_ < auVar70._8_8_);
              auVar70 = blendvpd(in_XMM15,auVar70,auVar33);
              auVar34._0_8_ = -(ulong)(auVar42._0_8_ < auVar70._0_8_);
              auVar34._8_8_ = -(ulong)(auVar42._8_8_ < auVar70._8_8_);
              auVar70 = blendvpd(auVar42,auVar70,auVar34);
              auVar35._0_8_ = -(ulong)(auVar82._0_8_ < auVar70._0_8_);
              auVar35._8_8_ = -(ulong)(auVar82._8_8_ < auVar70._8_8_);
              local_388 = blendvpd(auVar82,auVar70,auVar35);
            }
            ptr_01[uVar18] = lVar19;
            ptr_02[uVar18] = in_XMM15._0_8_;
            ptr_03[uVar18] = auVar42._0_8_;
            ptr_04[uVar18] = auVar82._0_8_;
            ptr_05[uVar18] = auVar58._0_8_;
            ptr_06[uVar18] = local_258._0_8_;
            ptr_07[uVar18] = local_268._0_8_;
            ptr_08[uVar18] = local_478._0_8_;
            auVar50._8_4_ = 0xffffffff;
            auVar50._0_8_ = 0xffffffffffffffff;
            auVar50._12_4_ = 0xffffffff;
            auVar36._0_8_ = -(ulong)(-1 < (long)local_498._0_8_);
            auVar36._8_8_ = -(ulong)(auVar50._8_8_ < (long)local_498._8_8_);
            auVar56._0_8_ = -(ulong)((long)local_498._0_8_ < (long)local_158._0_8_);
            auVar56._8_8_ = -(ulong)((long)local_498._8_8_ < (long)local_158._8_8_);
            auVar8._8_8_ = -(ulong)(lVar39 == lVar1);
            auVar8._0_8_ = -(ulong)(lVar29 == lVar1);
            auVar51._0_8_ = -(ulong)(local_2c8._0_8_ < lVar19);
            auVar51._8_8_ = -(ulong)(local_2c8._8_8_ < lVar53);
            auVar51 = auVar51 & auVar56 & auVar8 & auVar36;
            local_2c8 = blendvpd(local_2c8,auVar59,auVar51);
            local_368 = blendvpd(local_368,auVar79,auVar51);
            auVar57._0_8_ = -(ulong)(local_498._0_8_ == lVar2);
            auVar57._8_8_ = -(ulong)(local_498._8_8_ == lVar2);
            local_358 = blendvpd(local_358,auVar74,auVar51);
            auVar7._8_8_ = -(ulong)(lVar39 < (long)local_188._8_8_);
            auVar7._0_8_ = -(ulong)(lVar29 < (long)local_188._0_8_);
            local_348 = blendvpd(local_348,auVar63,auVar51);
            auVar60._0_8_ = -(ulong)(local_2d8._0_8_ < lVar19);
            auVar60._8_8_ = -(ulong)(local_2d8._8_8_ < lVar53);
            auVar60 = auVar60 & auVar57 & auVar7;
            local_2d8 = blendvpd(local_2d8,local_278,auVar60);
            local_418 = ~auVar43 & local_418;
            local_398 = blendvpd(local_398,in_XMM15,auVar60);
            local_338 = blendvpd(local_338,auVar42,auVar60);
            local_448 = ~auVar43 & local_448;
            local_328 = blendvpd(local_328,auVar82,auVar60);
            auVar57 = auVar57 & auVar8;
            local_318 = blendvpd(local_318,local_278,auVar57);
            local_4b8 = ~auVar43 & local_4b8;
            local_308 = blendvpd(local_308,in_XMM15,auVar57);
            auVar71._8_4_ = 0xffffffff;
            auVar71._0_8_ = 0xffffffffffffffff;
            auVar71._12_4_ = 0xffffffff;
            local_228 = blendvpd(local_228,auVar42,auVar57);
            local_238 = blendvpd(local_238,auVar82,auVar57);
            local_2e8 = blendvpd(local_2e8,auVar66,auVar60);
            local_248 = blendvpd(local_248,local_498,auVar51);
            local_498._8_8_ = local_498._8_8_ - auVar71._8_8_;
            local_498._0_8_ = local_498._0_8_ + 1;
            uVar18 = uVar18 + 1;
            local_178._0_8_ = uVar10;
            iVar77 = lStack_80;
            lVar19 = local_98._0_8_;
            lVar53 = iVar6;
            lVar15 = local_a8._0_8_;
            lVar65 = iVar5;
            lVar72 = local_b8._0_8_;
            lVar75 = iVar4;
          } while (s2Len + 1 != uVar18);
          auVar66._0_8_ = lVar29 + 2;
          auVar66._8_8_ = lVar39 + 2;
          local_3a8._8_8_ = local_3a8._8_8_ - local_288._8_8_;
          local_3a8._0_8_ = local_3a8._0_8_ - local_288._0_8_;
          local_188 = auVar46;
          local_178 = auVar41;
          local_158 = auVar45;
        } while ((long)local_298 < lVar27);
      }
      local_1a8 = local_368;
      local_1b8 = local_358;
      local_1c8 = local_348;
      local_1d8 = local_398;
      local_1e8 = local_338;
      local_1f8 = local_328;
      local_208 = local_318;
      local_218 = local_308;
      lVar19 = 0;
      lVar27 = lVar22;
      lVar17 = lVar22;
      bVar25 = true;
      local_428 = lVar22;
      local_498._0_8_ = lVar22;
      local_418._0_8_ = lVar22;
      local_408 = lVar22;
      local_4b8._0_4_ = uVar11;
      local_448._0_4_ = uVar16;
      local_478._0_8_ = lVar22;
      local_458 = lVar22;
      local_468 = lVar22;
      local_3d8._0_8_ = lVar22;
      local_3e8._0_8_ = lVar22;
      do {
        lVar53 = *(long *)(local_2d8 + lVar19);
        if (lVar22 < lVar53) {
          lVar15 = *(long *)(local_2e8 + lVar19);
LAB_006992d7:
          local_498._0_8_ = *(undefined8 *)(local_1d8 + lVar19);
          local_418._0_8_ = *(undefined8 *)(local_1e8 + lVar19);
          local_408 = *(long *)(local_1f8 + lVar19);
          local_4b8._0_4_ = (undefined4)lVar15;
          lVar22 = lVar53;
        }
        else if ((lVar53 == lVar22) &&
                (lVar15 = *(long *)(local_2e8 + lVar19), lVar15 < (int)local_4b8._0_4_))
        goto LAB_006992d7;
        if (lVar17 < *(long *)(local_2c8 + lVar19)) {
          local_448._0_4_ = *(undefined4 *)(local_248 + lVar19);
          local_478._0_8_ = *(undefined8 *)(local_1a8 + lVar19);
          local_458 = *(long *)(local_1b8 + lVar19);
          local_468 = *(long *)(local_1c8 + lVar19);
          lVar17 = *(long *)(local_2c8 + lVar19);
        }
        lVar53 = *(long *)(local_208 + lVar19);
        if (lVar27 < lVar53) {
          local_3d8._0_8_ = *(undefined8 *)(local_218 + lVar19);
          local_3e8._0_8_ = *(undefined8 *)(local_228 + lVar19);
          local_428 = *(long *)(local_238 + lVar19);
          lVar27 = lVar53;
        }
        lVar19 = lVar19 + 8;
        bVar9 = !bVar25;
        bVar25 = false;
        if (bVar9) {
          uVar14 = (uint)CONCAT71((int7)((ulong)lVar53 >> 8),s2_end == 0);
          iVar24 = (int)local_408;
          iVar23 = (int)local_418._0_8_;
          if (s1_end == 0 || s2_end == 0) {
            if (s1_end == 0) {
              iVar24 = (int)local_428;
              if (s2_end != 0) {
                iVar24 = (int)local_468;
              }
              lVar22 = lVar27;
              uVar14 = uVar11;
              iVar23 = (int)local_3e8._0_8_;
              local_4b8._0_4_ = uVar11;
              local_498._0_4_ = local_3d8._0_4_;
              if (s2_end != 0) {
                lVar22 = lVar17;
                uVar16 = local_448._0_4_;
                iVar23 = (int)local_458;
                local_498._0_4_ = local_478._0_4_;
              }
            }
          }
          else if ((lVar22 <= lVar17) &&
                  ((lVar22 != lVar17 || (uVar14 = local_448._0_4_, local_448._0_4_ != uVar16)))) {
            lVar22 = lVar17;
            uVar16 = local_448._0_4_;
            uVar14 = uVar11;
            iVar23 = (int)local_458;
            iVar24 = (int)local_468;
            local_4b8._0_4_ = uVar11;
            local_498._0_4_ = local_478._0_4_;
          }
          iVar21 = (int)lVar22;
          auVar37._8_4_ = (int)local_2b8;
          auVar37._0_8_ = local_2b8;
          auVar37._12_4_ = (int)(local_2b8 >> 0x20);
          auVar64._0_8_ = -(ulong)((long)local_2b8 < local_378._0_8_);
          auVar64._8_8_ = -(ulong)(auVar37._8_8_ < local_378._8_8_);
          auVar38._8_4_ = 0xffffffff;
          auVar38._0_8_ = 0xffffffffffffffff;
          auVar38._12_4_ = 0xffffffff;
          auVar44._8_4_ = (int)lVar20;
          auVar44._0_8_ = lVar20;
          auVar44._12_4_ = uVar61;
          auVar52._0_8_ = -(ulong)(lVar20 < local_388._0_8_);
          auVar52._8_8_ = -(ulong)(auVar44._8_8_ < local_388._8_8_);
          iVar26 = movmskpd(uVar14,auVar52 | auVar38 ^ auVar64);
          if (iVar26 != 0) {
            *(byte *)&ppVar12->flag = (byte)ppVar12->flag | 0x40;
            iVar24 = 0;
            iVar23 = 0;
            local_498._0_4_ = 0;
            iVar21 = 0;
            uVar16 = 0;
            local_4b8._0_4_ = 0;
          }
          ppVar12->score = iVar21;
          ppVar12->end_query = local_4b8._0_4_;
          ppVar12->end_ref = uVar16;
          ((ppVar12->field_4).stats)->matches = local_498._0_4_;
          ((ppVar12->field_4).stats)->similar = iVar23;
          ((ppVar12->field_4).stats)->length = iVar24;
          local_138 = auVar30;
          parasail_free(ptr_08);
          parasail_free(ptr_07);
          parasail_free(ptr_06);
          parasail_free(ptr_05);
          parasail_free(ptr_04);
          parasail_free(ptr_03);
          parasail_free(ptr_02);
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          return ppVar12;
        }
      } while( true );
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _HM_pr = NULL;
    int64_t * restrict _HS_pr = NULL;
    int64_t * restrict _HL_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict _FM_pr = NULL;
    int64_t * restrict _FS_pr = NULL;
    int64_t * restrict _FL_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict HM_pr = NULL;
    int64_t * restrict HS_pr = NULL;
    int64_t * restrict HL_pr = NULL;
    int64_t * restrict F_pr = NULL;
    int64_t * restrict FM_pr = NULL;
    int64_t * restrict FS_pr = NULL;
    int64_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxMRow;
    __m128i vMaxSRow;
    __m128i vMaxLRow;
    __m128i vMaxHCol;
    __m128i vMaxMCol;
    __m128i vMaxSCol;
    __m128i vMaxLCol;
    __m128i vLastValH;
    __m128i vLastValM;
    __m128i vLastValS;
    __m128i vLastValL;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_set1_epi64x_rpl(0);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vGapN = s1_beg ? _mm_set1_epi64x_rpl(0) : _mm_set1_epi64x_rpl(gap*N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxHRow = vNegInf;
    vMaxMRow = vNegInf;
    vMaxSRow = vNegInf;
    vMaxLRow = vNegInf;
    vMaxHCol = vNegInf;
    vMaxMCol = vNegInf;
    vMaxSCol = vNegInf;
    vMaxLCol = vNegInf;
    vLastValH = vNegInf;
    vLastValM = vNegInf;
    vLastValS = vNegInf;
    vLastValL = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vILimit1 = _mm_sub_epi64(vILimit, vOne);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);
    vJLimit1 = _mm_sub_epi64(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi64x_rpl(0) : _mm_set_epi64x_rpl(
            -open-0*gap,
            -open-1*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int64_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            HM_pr[j] = 0;
            HS_pr[j] = 0;
            HL_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
            FM_pr[j] = 0;
            FS_pr[j] = 0;
            FL_pr[j] = 0;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            HM_pr[j] = 0;
            HS_pr[j] = 0;
            HL_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
            FM_pr[j] = 0;
            FS_pr[j] = 0;
            FL_pr[j] = 0;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i vNH = vNegInf;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vNegInf;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi64x_rpl(
                s1[i+0],
                s1[i+1]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        __m128i vIltLimit = _mm_cmplt_epi64_rpl(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi64(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 8);
        vNH = _mm_insert_epi64_rpl(vNH, H_pr[-1], 1);
        vWH = _mm_srli_si128(vWH, 8);
        vWH = _mm_insert_epi64_rpl(vWH, s1_beg ? 0 : (-open - i*gap), 1);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vNM = _mm_srli_si128(vWM, 8);
            vNM = _mm_insert_epi64_rpl(vNM, HM_pr[j], 1);
            vNS = _mm_srli_si128(vWS, 8);
            vNS = _mm_insert_epi64_rpl(vNS, HS_pr[j], 1);
            vNL = _mm_srli_si128(vWL, 8);
            vNL = _mm_insert_epi64_rpl(vNL, HL_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vFM = _mm_srli_si128(vFM, 8);
            vFM = _mm_insert_epi64_rpl(vFM, FM_pr[j], 1);
            vFS = _mm_srli_si128(vFS, 8);
            vFS = _mm_insert_epi64_rpl(vFS, FS_pr[j], 1);
            vFL = _mm_srli_si128(vFL, 8);
            vFL = _mm_insert_epi64_rpl(vFL, FL_pr[j], 1);
            vF_opn = _mm_sub_epi64(vNH, vOpen);
            vF_ext = _mm_sub_epi64(vF, vGap);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vNM, case1);
            vFS = _mm_blendv_epi8(vFS, vNS, case1);
            vFL = _mm_blendv_epi8(vFL, vNL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vE_opn = _mm_sub_epi64(vWH, vOpen);
            vE_ext = _mm_sub_epi64(vE, vGap);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vWM, case1);
            vES = _mm_blendv_epi8(vES, vWS, case1);
            vEL = _mm_blendv_epi8(vEL, vWL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 8);
            vs2 = _mm_insert_epi64_rpl(vs2, s2[j], 1);
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            case1 = _mm_cmpeq_epi64(vWH, vNWH);
            case2 = _mm_cmpeq_epi64(vWH, vF);
            vWM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi64(vs1,vs2),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi64_rpl(vMat,vZero),
                            vOne)),
                    case1);
            vWL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vNWL, vOne), case1);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            HM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWM,0);
            HS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWS,0);
            HL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWL,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            FM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFM,0);
            FS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFS,0);
            FL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFL,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi64(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi64_rpl(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi64_rpl(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi64_rpl(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi64_rpl(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxMRow = _mm_blendv_epi8(vMaxMRow, vWM, cond_all_row);
                vMaxSRow = _mm_blendv_epi8(vMaxSRow, vWS, cond_all_row);
                vMaxLRow = _mm_blendv_epi8(vMaxLRow, vWL, cond_all_row);
                vMaxHCol = _mm_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vMaxMCol = _mm_blendv_epi8(vMaxMCol, vWM, cond_all_col);
                vMaxSCol = _mm_blendv_epi8(vMaxSCol, vWS, cond_all_col);
                vMaxLCol = _mm_blendv_epi8(vMaxLCol, vWL, cond_all_col);
                vLastValH = _mm_blendv_epi8(vLastValH, vWH, cond_last_val);
                vLastValM = _mm_blendv_epi8(vLastValM, vWM, cond_last_val);
                vLastValS = _mm_blendv_epi8(vLastValS, vWS, cond_last_val);
                vLastValL = _mm_blendv_epi8(vLastValL, vWL, cond_last_val);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
        vIBoundary = _mm_sub_epi64(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int64_t max_rowh = NEG_LIMIT;
        int64_t max_rowm = NEG_LIMIT;
        int64_t max_rows = NEG_LIMIT;
        int64_t max_rowl = NEG_LIMIT;
        int64_t max_colh = NEG_LIMIT;
        int64_t max_colm = NEG_LIMIT;
        int64_t max_cols = NEG_LIMIT;
        int64_t max_coll = NEG_LIMIT;
        int64_t last_valh = NEG_LIMIT;
        int64_t last_valm = NEG_LIMIT;
        int64_t last_vals = NEG_LIMIT;
        int64_t last_vall = NEG_LIMIT;
        int64_t *rh = (int64_t*)&vMaxHRow;
        int64_t *rm = (int64_t*)&vMaxMRow;
        int64_t *rs = (int64_t*)&vMaxSRow;
        int64_t *rl = (int64_t*)&vMaxLRow;
        int64_t *ch = (int64_t*)&vMaxHCol;
        int64_t *cm = (int64_t*)&vMaxMCol;
        int64_t *cs = (int64_t*)&vMaxSCol;
        int64_t *cl = (int64_t*)&vMaxLCol;
        int64_t *lh = (int64_t*)&vLastValH;
        int64_t *lm = (int64_t*)&vLastValM;
        int64_t *ls = (int64_t*)&vLastValS;
        int64_t *ll = (int64_t*)&vLastValL;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++rh, ++rm, ++rs, ++rl, ++ch, ++cm, ++cs, ++cl, ++lh, ++lm, ++ls, ++ll, ++i, ++j) {
            if (*ch > max_colh || (*ch == max_colh && *i < end_query)) {
                max_colh = *ch;
                end_query = *i;
                max_colm = *cm;
                max_cols = *cs;
                max_coll = *cl;
            }
            if (*rh > max_rowh) {
                max_rowh = *rh;
                end_ref = *j;
                max_rowm = *rm;
                max_rows = *rs;
                max_rowl = *rl;
            }
            if (*lh > last_valh) {
                last_valh = *lh;
                last_valm = *lm;
                last_vals = *ls;
                last_vall = *ll;
            }
        }
        if (s1_end && s2_end) {
            if (max_colh > max_rowh || (max_colh == max_rowh && end_ref == s2Len-1)) {
                score = max_colh;
                end_ref = s2Len-1;
                matches = max_colm;
                similar = max_cols;
                length = max_coll;
            }
            else {
                score = max_rowh;
                end_query = s1Len-1;
                matches = max_rowm;
                similar = max_rows;
                length = max_rowl;
            }
        }
        else if (s1_end) {
            score = max_colh;
            end_ref = s2Len-1;
            matches = max_colm;
            similar = max_cols;
            length = max_coll;
        }
        else if (s2_end) {
            score = max_rowh;
            end_query = s1Len-1;
            matches = max_rowm;
            similar = max_rows;
            length = max_rowl;
        }
        else {
            score = last_valh;
            end_query = s1Len-1;
            end_ref = s2Len-1;
            matches = last_valm;
            similar = last_vals;
            length = last_vall;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}